

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O2

void __thiscall
so_5::state_t::time_limit_t::set_up_limit_for_agent
          (time_limit_t *this,agent_t *agent,state_t *current_state)

{
  anon_class_24_3_65445c79 lambda;
  state_t *in_stack_ffffffffffffffe0;
  
  lambda.agent = (agent_t *)current_state;
  lambda.this = (time_limit_t *)agent;
  lambda.current_state = in_stack_ffffffffffffffe0;
  details::
  invoke_noexcept_code<so_5::state_t::time_limit_t::set_up_limit_for_agent(so_5::agent_t&,so_5::state_t_const&)::_lambda()_1_>
            (lambda);
  return;
}

Assistant:

void
	set_up_limit_for_agent(
		agent_t & agent,
		const state_t & current_state ) SO_5_NOEXCEPT
	{
		// Because this method is called from on_enter handler it can't
		// throw exceptions. Any exception will lead to abort of the application.
		// So we don't care about exception safety.
		so_5::details::invoke_noexcept_code( [&] {

			// New unique mbox is necessary for time limit.
			m_unique_mbox = impl::internal_env_iface_t{ agent.so_environment() }
					// A new MPSC mbox will be used for that.
					.create_mpsc_mbox(
							// New MPSC mbox will be directly connected to target agent.
							&agent,
							// Message limits will not be used.
							nullptr );

			// A subscription must be created for timeout signal.
			agent.so_subscribe( m_unique_mbox )
					.in( current_state )
					.event< timeout >( [&agent, this] {
						agent.so_change_state( m_state_to_switch );
					} );

			// Delayed timeout signal must be sent.
			m_timer = agent.so_environment().schedule_timer< timeout >(
					m_unique_mbox,
					m_limit,
					duration_t::zero() );
		} );
	}